

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O1

int run_test_getaddrinfo_basic(void)

{
  int iVar1;
  uv_getaddrinfo_t *puVar2;
  undefined8 uVar3;
  undefined4 *puVar4;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long extraout_RDX_01;
  undefined8 unaff_RBX;
  size_t *psVar6;
  undefined8 *puVar7;
  int *piVar8;
  long lVar9;
  undefined1 auStack_b8 [144];
  undefined8 uStack_28;
  code *pcStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x15b7bd;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  pcStack_10 = (code *)0x15b7c9;
  puVar2 = (uv_getaddrinfo_t *)uv_default_loop();
  pcStack_10 = (code *)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar2,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    pcStack_10 = (code *)0x15b7f5;
    puVar2 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_10 = (code *)0x15b7ff;
    uv_run(puVar2,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    pcStack_10 = (code *)0x15b80d;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x15b821;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_10 = (code *)0x15b82b;
    uv_run(unaff_RBX,0);
    pcStack_10 = (code *)0x15b830;
    puVar2 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_10 = (code *)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    pcStack_10 = (code *)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  pcStack_10 = getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  pcStack_10 = (code *)unaff_RBX;
  if (getaddrinfo_handle == puVar2) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    pcStack_18 = (code *)0x15b867;
    free(puVar2);
    iVar1 = uv_freeaddrinfo(extraout_RDX);
    return iVar1;
  }
  pcStack_18 = run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  pcStack_18 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar3,auStack_b8,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_28);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar2 = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar7 = (undefined8 *)0x4;
    puVar4 = (undefined4 *)malloc(4);
    if (puVar4 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar4 = (int)lVar9;
    puVar2->data = puVar4;
    puVar7 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar7,puVar2,getaddrinfo_cuncurrent_cb,"localhost",0,0,unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar9 = lVar9 + 1;
    puVar2 = puVar2 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar7 = (undefined8 *)uv_default_loop();
  lVar9 = 0;
  uv_run(puVar7,0);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_0015b9e9;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  puVar7 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar8 = (int *)*puVar7;
  piVar5 = callback_counts;
  psVar6 = &closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    psVar6 = psVar6 + 0x14;
    if (psVar6 == puVar7) goto LAB_0015ba2b;
    piVar5 = piVar5 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_01;
LAB_0015ba2b:
  if (*piVar8 == (int)lVar9) {
    *piVar5 = *piVar5 + 1;
    free(piVar8);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar8,0);
  return iVar1;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

TEST_IMPL(getaddrinfo_basic) {
  int r;
  getaddrinfo_handle = (uv_getaddrinfo_t*)malloc(sizeof(uv_getaddrinfo_t));

  r = uv_getaddrinfo(uv_default_loop(),
                     getaddrinfo_handle,
                     &getaddrinfo_basic_cb,
                     name,
                     NULL,
                     NULL);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(getaddrinfo_cbs == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}